

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O3

optional_ptr<duckdb::MapCastNode,_true> __thiscall
duckdb::MapCastInfo::GetEntry(MapCastInfo *this,LogicalType *source,LogicalType *target)

{
  _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  bool bVar1;
  _Node_iterator_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
  _Var2;
  _Node_iterator_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
  _Var3;
  LogicalType *pLVar4;
  LogicalType *pLVar5;
  LogicalType *pLVar6;
  _Node_iterator_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
  _Var7;
  _Node_iterator_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true> _Var8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *pvVar9;
  _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  MapCastNode *pMVar10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_02;
  allocator_type local_b1;
  LogicalType local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  child_list_t<LogicalType> local_60;
  child_list_t<LogicalType> local_48;
  
  local_98[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 )source->id_;
  _Var2._M_cur = (__node_type *)
                 ::std::_Hashtable<$3d859558$>::find(&(this->casts)._M_h,(key_type *)local_98);
  if (_Var2._M_cur == (__node_type *)0x0) {
    local_98[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                   )0x3;
    _Var2._M_cur = (__node_type *)
                   ::std::_Hashtable<$3d859558$>::find(&(this->casts)._M_h,(key_type *)local_98);
    if (_Var2._M_cur != (__node_type *)0x0) goto LAB_0080bfd5;
    goto LAB_0080c562;
  }
LAB_0080bfd5:
  this_00 = (_Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(&((_Var2._M_cur)->
                 super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>_>
                 ._M_storage._M_storage.__align + 1);
  _Var3._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_00,source);
  if (_Var3._M_cur != (__node_type *)0x0) goto LAB_0080c284;
  switch(source->id_) {
  case STRUCT:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_98,(char (*) [4])0x1360d3b,&LogicalType::ANY);
    __l._M_len = 1;
    __l._M_array = (iterator)local_98;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_48,__l,&local_b1);
    LogicalType::STRUCT(&local_b0,&local_48);
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,&local_b0);
    LogicalType::~LogicalType(&local_b0);
    pvVar9 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_48;
    break;
  case LIST:
    LogicalType::LogicalType(&local_b0,ANY);
    LogicalType::LIST((LogicalType *)local_98,&local_b0);
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_98);
    goto LAB_0080c264;
  case MAP:
    for (_Var3._M_cur = *(__node_type **)
                         ((long)&((_Var2._M_cur)->
                                 super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>_>_>_>
                                 ._M_storage._M_storage + 0x18); _Var3._M_cur != (__node_type *)0x0;
        _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt) {
      if (((_Var3._M_cur)->
          super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>
          ._M_storage._M_storage.__data[0] == 'f') {
        pLVar4 = MapType::KeyType((LogicalType *)
                                  &(_Var3._M_cur)->
                                   super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                                 );
        pLVar5 = MapType::ValueType((LogicalType *)
                                    &(_Var3._M_cur)->
                                     super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                                   );
        LogicalType::LogicalType((LogicalType *)local_98,ANY);
        bVar1 = LogicalType::operator==(pLVar4,(LogicalType *)local_98);
        if (!bVar1) {
          pLVar6 = MapType::KeyType(source);
          bVar1 = LogicalType::operator==(pLVar4,pLVar6);
          if (!bVar1) {
            LogicalType::~LogicalType((LogicalType *)local_98);
            goto LAB_0080c172;
          }
        }
        LogicalType::LogicalType(&local_b0,ANY);
        bVar1 = LogicalType::operator==(pLVar5,&local_b0);
        if (bVar1) {
          LogicalType::~LogicalType(&local_b0);
          LogicalType::~LogicalType((LogicalType *)local_98);
          goto LAB_0080c284;
        }
        pLVar4 = MapType::ValueType(source);
        bVar1 = LogicalType::operator==(pLVar5,pLVar4);
        LogicalType::~LogicalType(&local_b0);
        LogicalType::~LogicalType((LogicalType *)local_98);
        if (bVar1) goto LAB_0080c284;
      }
LAB_0080c172:
    }
    goto LAB_0080c562;
  default:
    LogicalType::LogicalType((LogicalType *)local_98,ANY);
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_98);
    pLVar4 = (LogicalType *)local_98;
    goto LAB_0080c276;
  case UNION:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_98,(char (*) [4])0x1360d3b,&LogicalType::ANY);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_98;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_60,__l_00,&local_b1);
    LogicalType::UNION(&local_b0,&local_60);
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,&local_b0);
    LogicalType::~LogicalType(&local_b0);
    pvVar9 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_60;
    break;
  case ARRAY:
    LogicalType::LogicalType(&local_b0,ANY);
    LogicalType::ARRAY((LogicalType *)local_98,&local_b0,(optional_idx)0xffffffffffffffff);
    _Var3._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,(key_type *)local_98);
LAB_0080c264:
    LogicalType::~LogicalType((LogicalType *)local_98);
    pLVar4 = &local_b0;
LAB_0080c276:
    LogicalType::~LogicalType(pLVar4);
    goto LAB_0080c27b;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(pvVar9);
  LogicalType::~LogicalType
            (&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)local_98)->second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._1_7_,local_98[0]) !=
      &(((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)local_98)->first).field_2) {
    operator_delete((void *)CONCAT71(local_98._1_7_,local_98[0]));
  }
LAB_0080c27b:
  if (_Var3._M_cur == (__node_type *)0x0) goto LAB_0080c562;
LAB_0080c284:
  this_02 = (_Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)((long)&((_Var3._M_cur)->
                       super__Hash_node_value<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>
                       ._M_storage._M_storage + 0x18);
  local_98[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 )target->id_;
  _Var7._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_02,(key_type *)local_98);
  if (_Var7._M_cur == (__node_type *)0x0) {
    local_98[0] = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                   )0x3;
    _Var7._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_02,(key_type *)local_98);
    if (_Var7._M_cur == (__node_type *)0x0) goto LAB_0080c562;
  }
  this_01 = (_Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(&((_Var7._M_cur)->
                 super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>
                 ._M_storage._M_storage.__align + 1);
  _Var8._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_01,target);
  if (_Var8._M_cur != (__node_type *)0x0) goto LAB_0080c55c;
  switch(target->id_) {
  case STRUCT:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_98,(char (*) [4])0x1360d3b,&LogicalType::ANY);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_98;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_48,__l_01,&local_b1);
    LogicalType::STRUCT(&local_b0,&local_48);
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,&local_b0);
    LogicalType::~LogicalType(&local_b0);
    pvVar9 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_48;
    break;
  case LIST:
    LogicalType::LogicalType(&local_b0,ANY);
    LogicalType::LIST((LogicalType *)local_98,&local_b0);
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_98);
    goto LAB_0080c540;
  case MAP:
    _Var8._M_cur = *(__node_type **)
                    ((long)&((_Var7._M_cur)->
                            super__Hash_node_value<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>
                            ._M_storage._M_storage + 0x18);
    if (_Var8._M_cur != (__node_type *)0x0) {
      do {
        if (((_Var8._M_cur)->
            super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>)
            .super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>
            ._M_storage._M_storage.__data[0] == 'f') {
          pLVar4 = MapType::KeyType((LogicalType *)
                                    &(_Var8._M_cur)->
                                     super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                                   );
          pLVar5 = MapType::ValueType((LogicalType *)
                                      &(_Var8._M_cur)->
                                       super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                                     );
          LogicalType::LogicalType((LogicalType *)local_98,ANY);
          bVar1 = LogicalType::operator==(pLVar4,(LogicalType *)local_98);
          if (!bVar1) {
            pLVar6 = MapType::KeyType(target);
            bVar1 = LogicalType::operator==(pLVar4,pLVar6);
            if (!bVar1) {
              LogicalType::~LogicalType((LogicalType *)local_98);
              goto LAB_0080c445;
            }
          }
          LogicalType::LogicalType(&local_b0,ANY);
          bVar1 = LogicalType::operator==(pLVar5,&local_b0);
          if (bVar1) {
            LogicalType::~LogicalType(&local_b0);
            LogicalType::~LogicalType((LogicalType *)local_98);
            goto LAB_0080c55c;
          }
          pLVar4 = MapType::ValueType(target);
          bVar1 = LogicalType::operator==(pLVar5,pLVar4);
          LogicalType::~LogicalType(&local_b0);
          LogicalType::~LogicalType((LogicalType *)local_98);
          if (bVar1) goto LAB_0080c55c;
        }
LAB_0080c445:
        _Var8._M_cur = (__node_type *)((_Var8._M_cur)->super__Hash_node_base)._M_nxt;
      } while (_Var8._M_cur != (__node_type *)0x0);
    }
    goto LAB_0080c562;
  default:
    LogicalType::LogicalType((LogicalType *)local_98,ANY);
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_98);
    pLVar4 = (LogicalType *)local_98;
    goto LAB_0080c552;
  case UNION:
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
              (local_98,(char (*) [4])0x1360d3b,&LogicalType::ANY);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_98;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_60,__l_02,&local_b1);
    LogicalType::UNION(&local_b0,&local_60);
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,&local_b0);
    LogicalType::~LogicalType(&local_b0);
    pvVar9 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_60;
    break;
  case ARRAY:
    LogicalType::LogicalType(&local_b0,ANY);
    LogicalType::ARRAY((LogicalType *)local_98,&local_b0,(optional_idx)0xffffffffffffffff);
    _Var8._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_01,(key_type *)local_98);
LAB_0080c540:
    LogicalType::~LogicalType((LogicalType *)local_98);
    pLVar4 = &local_b0;
LAB_0080c552:
    LogicalType::~LogicalType(pLVar4);
    goto LAB_0080c557;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(pvVar9);
  LogicalType::~LogicalType
            (&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)local_98)->second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._1_7_,local_98[0]) !=
      &(((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)local_98)->first).field_2) {
    operator_delete((void *)CONCAT71(local_98._1_7_,local_98[0]));
  }
LAB_0080c557:
  if (_Var8._M_cur == (__node_type *)0x0) {
LAB_0080c562:
    pMVar10 = (MapCastNode *)0x0;
  }
  else {
LAB_0080c55c:
    pMVar10 = (MapCastNode *)
              ((long)&((_Var8._M_cur)->
                      super__Hash_node_value<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>
                      ._M_storage._M_storage + 0x18);
  }
  return (optional_ptr<duckdb::MapCastNode,_true>)pMVar10;
}

Assistant:

const optional_ptr<MapCastNode> GetEntry(const LogicalType &source, const LogicalType &target) {
		auto source_type_id_entry = casts.find(source.id());
		if (source_type_id_entry == casts.end()) {
			source_type_id_entry = casts.find(LogicalTypeId::ANY);
			if (source_type_id_entry == casts.end()) {
				return nullptr;
			}
		}

		auto &source_type_entries = source_type_id_entry->second;
		auto source_type_entry = source_type_entries.find(source);
		if (source_type_entry == source_type_entries.end()) {
			source_type_entry = RelaxedTypeMatch(source_type_entries, source);
			if (source_type_entry == source_type_entries.end()) {
				return nullptr;
			}
		}

		auto &target_type_id_entries = source_type_entry->second;
		auto target_type_id_entry = target_type_id_entries.find(target.id());
		if (target_type_id_entry == target_type_id_entries.end()) {
			target_type_id_entry = target_type_id_entries.find(LogicalTypeId::ANY);
			if (target_type_id_entry == target_type_id_entries.end()) {
				return nullptr;
			}
		}

		auto &target_type_entries = target_type_id_entry->second;
		auto target_type_entry = target_type_entries.find(target);
		if (target_type_entry == target_type_entries.end()) {
			target_type_entry = RelaxedTypeMatch(target_type_entries, target);
			if (target_type_entry == target_type_entries.end()) {
				return nullptr;
			}
		}

		return &target_type_entry->second;
	}